

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O0

int anon_unknown.dwarf_17824::SMPI_Allgather_Impl<unsigned_char>
              (uchar *sendbuf,int sendcount,void *recvbuf,int recvcount,SMPI_Datatype recvtype,
              SMPI_Comm comm)

{
  size_t recvcount_00;
  size_t sendcount_00;
  int in_ECX;
  unsigned_long *in_RDX;
  int in_ESI;
  string *in_RDI;
  undefined4 in_R8D;
  Comm *in_R9;
  string *in_stack_fffffffffffffe68;
  size_t in_stack_fffffffffffffe70;
  long *in_stack_fffffffffffffe78;
  size_t in_stack_fffffffffffffe80;
  uchar *in_stack_fffffffffffffe88;
  string *this;
  Comm *in_stack_fffffffffffffe90;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [48];
  string local_48 [72];
  
  switch(in_R8D) {
  case 0:
    std::__cxx11::string::string(local_48);
    adios2::helper::Comm::Allgather<unsigned_char,int>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (int *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68)
    ;
    std::__cxx11::string::~string(local_48);
    break;
  case 1:
    std::__cxx11::string::string(local_98);
    adios2::helper::Comm::Allgather<unsigned_char,long>
              (in_R9,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
               in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_98);
    break;
  case 2:
    recvcount_00 = (size_t)in_ESI;
    sendcount_00 = (size_t)in_ECX;
    this = local_b8;
    std::__cxx11::string::string(this);
    adios2::helper::Comm::Allgather<unsigned_char,unsigned_long>
              (in_stack_fffffffffffffe90,(uchar *)this,sendcount_00,in_RDX,recvcount_00,in_RDI);
    std::__cxx11::string::~string(local_b8);
    break;
  case 3:
    std::__cxx11::string::string(local_78);
    adios2::helper::Comm::Allgather<unsigned_char,char>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (char *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68
              );
    std::__cxx11::string::~string(local_78);
    break;
  case 4:
    std::__cxx11::string::string(local_d8);
    adios2::helper::Comm::Allgather<unsigned_char,unsigned_char>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
               (uchar *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
               in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_d8);
  }
  return 0;
}

Assistant:

int SMPI_Allgather_Impl(const TSend *sendbuf, int sendcount, void *recvbuf, int recvcount,
                        SMPI_Datatype recvtype, SMPI_Comm comm)
{
    switch (recvtype)
    {
#define F(type) comm->Allgather(sendbuf, sendcount, static_cast<type *>(recvbuf), recvcount)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}